

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

QDate calculatePosixDate(QByteArray *dateRule,int year)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int m;
  uint uVar8;
  int in_R8D;
  QDate QVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QByteArrayView data;
  QByteArrayView data_00;
  bool ok;
  QArrayDataPointer<QByteArray> local_78;
  bool local_59;
  undefined1 local_58 [16];
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar9.jd = -0x8000000000000000;
  local_59 = true;
  pcVar2 = (dateRule->d).ptr;
  cVar1 = *pcVar2;
  if (cVar1 == 'J') {
    data_00.m_size = pcVar2 + 1;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    data_00.m_data = (storage_type *)0xa;
    QtPrivate::toSignedInteger
              ((ParsedNumber<long_long> *)local_58,(QtPrivate *)((dateRule->d).size + -1),data_00,
               in_R8D);
    bVar10 = (local_58._8_8_ & 1) == 0;
    bVar3 = (ulong)(local_58._0_8_ + 0x80000000) >> 0x20 == 0;
    local_59 = bVar3 && bVar10;
    uVar5 = 0;
    if (bVar3 && bVar10) {
      uVar5 = (uint)local_58._0_8_;
    }
    uVar8 = uVar5 - 1;
    if (0x16c < uVar8 || (!bVar3 || !bVar10)) goto LAB_003ff95b;
    bVar3 = QDate::isLeapYear(year);
    uVar6 = uVar8;
    if (bVar3) {
      uVar6 = uVar5;
    }
    if (uVar5 < 0x3c) {
      uVar6 = uVar8;
    }
    QDate::QDate((QDate *)local_58,year,1,1);
  }
  else {
    if (cVar1 == 'M') {
      local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
      QByteArray::split((QList<QByteArray> *)&local_78,dateRule,'.');
      if ((undefined1 *)0x2 < (ulong)local_78.size) {
        data.m_size = ((local_78.ptr)->d).ptr + 1;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        data.m_data = (storage_type *)0xa;
        QtPrivate::toSignedInteger
                  ((ParsedNumber<long_long> *)local_58,(QtPrivate *)(((local_78.ptr)->d).size + -1),
                   data,in_R8D);
        bVar10 = (local_58._8_8_ & 1) == 0;
        bVar3 = (ulong)(local_58._0_8_ + 0x80000000) >> 0x20 == 0;
        local_59 = bVar3 && bVar10;
        m = (int)local_58._0_8_;
        if (((bVar3 && bVar10) &&
            (iVar4 = QByteArray::toInt(local_78.ptr + 1,&local_59,10), (local_59 & 1U) != 0)) &&
           (uVar5 = QByteArray::toInt(local_78.ptr + 2,&local_59,10), local_59 == true)) {
          if (uVar5 == 0) {
            uVar5 = 7;
          }
          else if (((iVar4 - 6U < 0xfffffffb) || (m - 0xdU < 0xfffffff4)) || (7 < uVar5)) {
            local_58._0_8_ = (undefined1 *)0x8000000000000000;
            QVar9.jd = local_58._0_8_;
            goto LAB_003ff951;
          }
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QDate::QDate((QDate *)local_58,year,m,1);
          iVar7 = QDate::dayOfWeek((QDate *)local_58);
          uVar8 = uVar5 - 7;
          if ((int)uVar5 < iVar7) {
            uVar8 = uVar5;
          }
          local_58._0_8_ = QDate::addDays((QDate *)local_58,(long)(int)(uVar8 - iVar7));
          local_58._0_8_ = QDate::addDays((QDate *)local_58,(long)(iVar4 * 7));
          iVar4 = QDate::month((QDate *)local_58);
          QVar9.jd = local_58._0_8_;
          if (iVar4 != m) {
            do {
              local_58._0_8_ = QDate::addDays((QDate *)local_58,-7);
              iVar4 = QDate::month((QDate *)local_58);
              QVar9.jd = local_58._0_8_;
            } while (iVar4 != m);
          }
        }
      }
LAB_003ff951:
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_78);
      goto LAB_003ff95b;
    }
    uVar6 = QByteArray::toInt(dateRule,&local_59,10);
    if ((0x16d < uVar6) || (local_59 == false)) goto LAB_003ff95b;
    QDate::QDate((QDate *)local_58,year,1,1);
  }
  QVar9 = QDate::addDays((QDate *)local_58,(ulong)uVar6);
LAB_003ff95b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDate)QVar9.jd;
  }
  __stack_chk_fail();
}

Assistant:

static QDate calculatePosixDate(const QByteArray &dateRule, int year)
{
    Q_ASSERT(!dateRule.isEmpty());
    bool ok;
    // Can start with M, J, or a digit
    if (dateRule.at(0) == 'M') {
        // nth week in month format "Mmonth.week.dow"
        QList<QByteArray> dateParts = dateRule.split('.');
        if (dateParts.size() > 2) {
            Q_ASSERT(!dateParts.at(0).isEmpty()); // the 'M' is its [0].
            int month = QByteArrayView{ dateParts.at(0) }.sliced(1).toInt(&ok);
            int week = ok ? dateParts.at(1).toInt(&ok) : 0;
            int dow = ok ? dateParts.at(2).toInt(&ok) : 0;
            if (ok)
                return calculateDowDate(year, month, dow, week);
        }
    } else if (dateRule.at(0) == 'J') {
        // Day of Year 1...365, ignores Feb 29.
        // So March always starts on day 60.
        int doy = QByteArrayView{ dateRule }.sliced(1).toInt(&ok);
        if (ok && doy > 0 && doy < 366) {
            // Subtract 1 because we're adding days *after* the first of
            // January, unless it's after February in a leap year, when the leap
            // day cancels that out:
            if (!QDate::isLeapYear(year) || doy < 60)
                --doy;
            return QDate(year, 1, 1).addDays(doy);
        }
    } else {
        // Day of Year 0...365, includes Feb 29
        int doy = dateRule.toInt(&ok);
        if (ok && doy >= 0 && doy < 366)
            return QDate(year, 1, 1).addDays(doy);
    }
    return QDate();
}